

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGeneratorFactory.h
# Opt level: O1

unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> __thiscall
cmGlobalGeneratorSimpleFactory<cmGlobalUnixMakefileGenerator3>::CreateGlobalGenerator
          (cmGlobalGeneratorSimpleFactory<cmGlobalUnixMakefileGenerator3> *this,string *name,
          bool param_2,cmake *cm)

{
  int iVar1;
  cmGlobalUnixMakefileGenerator3 *this_00;
  undefined7 in_register_00000011;
  cmake *in_R8;
  undefined6 local_28;
  undefined2 uStack_22;
  undefined6 uStack_20;
  undefined1 local_1a;
  
  local_28 = 0x4d2078696e55;
  uStack_22 = 0x6b61;
  uStack_20 = 0x73656c696665;
  local_1a = 0;
  if (((undefined8 *)CONCAT71(in_register_00000011,param_2))[1] == 0xe) {
    iVar1 = bcmp(*(void **)CONCAT71(in_register_00000011,param_2),&local_28,0xe);
    if (iVar1 == 0) {
      this_00 = (cmGlobalUnixMakefileGenerator3 *)operator_new(0x7e0);
      cmGlobalUnixMakefileGenerator3::cmGlobalUnixMakefileGenerator3(this_00,in_R8);
      goto LAB_00322408;
    }
  }
  (this->super_cmGlobalGeneratorFactory)._vptr_cmGlobalGeneratorFactory = (_func_int **)0x0;
  this_00 = (cmGlobalUnixMakefileGenerator3 *)0x0;
LAB_00322408:
  (this->super_cmGlobalGeneratorFactory)._vptr_cmGlobalGeneratorFactory = (_func_int **)this_00;
  return (__uniq_ptr_data<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>,_true,_true>)
         (__uniq_ptr_data<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<cmGlobalGenerator> CreateGlobalGenerator(
    const std::string& name, bool /*allowArch*/, cmake* cm) const override
  {
    if (name != T::GetActualName()) {
      return std::unique_ptr<cmGlobalGenerator>();
    }
    return std::unique_ptr<cmGlobalGenerator>(cm::make_unique<T>(cm));
  }